

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

size_t duckdb_fmt::v6::internal::code_point_index(basic_string_view<char> s,size_t n)

{
  char *pcVar1;
  size_t sVar2;
  ulong in_RDX;
  size_t size;
  size_t i;
  size_t num_code_points;
  fmt_char8_t *data;
  size_t local_38;
  ulong local_30;
  basic_string_view<char> local_18;
  
  pcVar1 = basic_string_view<char>::data(&local_18);
  local_30 = 0;
  local_38 = 0;
  sVar2 = basic_string_view<char>::size(&local_18);
  while( true ) {
    if (local_38 == sVar2) {
      sVar2 = basic_string_view<char>::size(&local_18);
      return sVar2;
    }
    if ((((int)pcVar1[local_38] & 0xc0U) != 0x80) && (local_30 = local_30 + 1, in_RDX < local_30))
    break;
    local_38 = local_38 + 1;
  }
  return local_38;
}

Assistant:

inline size_t code_point_index(basic_string_view<fmt_char8_t> s, size_t n) {
  const fmt_char8_t* data = s.data();
  size_t num_code_points = 0;
  for (size_t i = 0, size = s.size(); i != size; ++i) {
    if ((data[i] & 0xc0) != 0x80 && ++num_code_points > n) {
      return i;
    }
  }
  return s.size();
}